

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void AnalyzeFunctionArgumentsEarly
               (ExpressionContext *ctx,SynCallArgument *argumentHead,
               SmallArray<ArgumentData,_16U> *resultArguments)

{
  SynCallArgument *pSVar1;
  bool bVar2;
  ArgumentData local_90;
  ExprBase *local_60;
  ExprBase *argument;
  SynCallArgument *local_28;
  SynCallArgument *el;
  SmallArray<ArgumentData,_16U> *resultArguments_local;
  SynCallArgument *argumentHead_local;
  ExpressionContext *ctx_local;
  
  el = (SynCallArgument *)resultArguments;
  resultArguments_local = (SmallArray<ArgumentData,_16U> *)argumentHead;
  argumentHead_local = (SynCallArgument *)ctx;
  for (local_28 = argumentHead; local_28 != (SynCallArgument *)0x0;
      local_28 = getType<SynCallArgument>((local_28->super_SynBase).next)) {
    bVar2 = isType<SynShortFunctionDefinition>(local_28->value);
    pSVar1 = el;
    if (bVar2) {
      ArgumentData::ArgumentData((ArgumentData *)&argument);
      SmallArray<ArgumentData,_16U>::push_back
                ((SmallArray<ArgumentData,_16U> *)pSVar1,(ArgumentData *)&argument);
    }
    else {
      local_60 = AnalyzeExpression((ExpressionContext *)argumentHead_local,local_28->value);
      pSVar1 = el;
      ArgumentData::ArgumentData
                (&local_90,&local_28->super_SynBase,false,local_28->name,local_60->type,local_60);
      SmallArray<ArgumentData,_16U>::push_back((SmallArray<ArgumentData,_16U> *)pSVar1,&local_90);
    }
  }
  return;
}

Assistant:

void AnalyzeFunctionArgumentsEarly(ExpressionContext &ctx, SynCallArgument *argumentHead, SmallArray<ArgumentData, 16> &resultArguments)
{
	for(SynCallArgument *el = argumentHead; el; el = getType<SynCallArgument>(el->next))
	{
		if(isType<SynShortFunctionDefinition>(el->value))
		{
			resultArguments.push_back(ArgumentData());
		}
		else
		{
			ExprBase *argument = AnalyzeExpression(ctx, el->value);

			resultArguments.push_back(ArgumentData(el, false, el->name, argument->type, argument));
		}
	}
}